

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LLVMDG2Dot.h
# Opt level: O2

bool __thiscall
dg::debug::LLVMDGDumpBlocks::dump(LLVMDGDumpBlocks *this,char *new_file,char *dump_func_only)

{
  _Base_ptr graph;
  bool bVar1;
  bool bVar2;
  long lVar3;
  size_t sVar4;
  char *name;
  _Rb_tree_node_base *p_Var5;
  StringRef SVar6;
  StringRef local_40;
  
  bVar1 = DG2Dot<dg::LLVMNode>::ensureFile(&this->super_DG2Dot<dg::LLVMNode>,new_file);
  if (bVar1) {
    lVar3 = dg::getConstructedFunctions();
    DG2Dot<dg::LLVMNode>::start(&this->super_DG2Dot<dg::LLVMNode>);
    p_Var5 = *(_Rb_tree_node_base **)(lVar3 + 0x18);
    while (p_Var5 != (_Rb_tree_node_base *)(lVar3 + 8)) {
      if (dump_func_only == (char *)0x0) {
LAB_00126ba5:
        graph = p_Var5[1]._M_parent;
        name = (char *)llvm::Value::getName();
        dumpSubgraph(this,(LLVMDependenceGraph *)graph,name);
      }
      else {
        SVar6 = (StringRef)llvm::Value::getName();
        local_40 = SVar6;
        sVar4 = strlen(dump_func_only);
        SVar6.Length = sVar4;
        SVar6.Data = dump_func_only;
        bVar2 = llvm::StringRef::equals(&local_40,SVar6);
        if (bVar2) goto LAB_00126ba5;
      }
      p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5);
    }
    DG2Dot<dg::LLVMNode>::end(&this->super_DG2Dot<dg::LLVMNode>);
  }
  return bVar1;
}

Assistant:

bool dump(const char *new_file = nullptr,
              const char *dump_func_only = nullptr) override {
        // make sure we have the file opened
        if (!ensureFile(new_file))
            return false;

        const std::map<llvm::Value *, LLVMDependenceGraph *> &CF =
                getConstructedFunctions();

        start();

        for (const auto &F : CF) {
            // XXX: this is inefficient, we can get the dump_func_only function
            // from the module (F.getParent()->getModule()->getFunction(...)
            if (dump_func_only && !F.first->getName().equals(dump_func_only))
                continue;

            dumpSubgraph(F.second, F.first->getName().data());
        }

        end();

        return true;
    }